

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findDeclaredFunctions.cpp
# Opt level: O0

void declareFunc(Function *func,Program *program)

{
  StringRef Prefix;
  StringRef Suffix;
  StringRef Suffix_00;
  StringRef Suffix_01;
  StringRef Suffix_02;
  StringRef Suffix_03;
  StringRef Suffix_04;
  bool bVar1;
  Argument *pAVar2;
  Argument *pAVar3;
  pointer pFVar4;
  IntegerType *pIVar5;
  Program *in_RSI;
  unique_ptr<Func,_std::default_delete<Func>_> *in_RDI;
  __single_object argVal;
  Value *arg;
  Argument *__end1;
  Argument *__begin1;
  iterator_range<const_llvm::Argument_*> *__range1;
  __single_object decl;
  Type *in_stack_fffffffffffffcf8;
  Program *in_stack_fffffffffffffd00;
  unique_ptr<Value,_std::default_delete<Value>_> *in_stack_fffffffffffffd08;
  Function *llvmFunc;
  Program *in_stack_fffffffffffffd10;
  Value *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  TypeHandler *in_stack_fffffffffffffd28;
  undefined6 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  bool local_24a;
  Function local_1a8 [24];
  undefined1 local_190 [16];
  undefined1 local_170 [16];
  undefined1 local_150 [16];
  undefined1 local_130 [16];
  undefined1 local_110 [16];
  undefined1 local_f0 [16];
  undefined1 local_d0 [16];
  iterator_range<const_llvm::Argument_*> local_c0;
  iterator_range<const_llvm::Argument_*> local_b0;
  Type *local_98;
  string local_90 [40];
  Argument *local_68;
  Argument *local_60;
  Argument *local_58;
  iterator_range<const_llvm::Argument_*> local_40;
  iterator_range<const_llvm::Argument_*> *local_30;
  undefined1 local_21;
  Program *local_10;
  unique_ptr<Func,_std::default_delete<Func>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_21 = llvm::GlobalValue::isDeclaration();
  std::make_unique<Func,llvm::Function_const*&,Program*,bool>
            ((Function **)in_stack_fffffffffffffd28,
             (Program **)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             (bool *)in_stack_fffffffffffffd18);
  local_40 = llvm::Function::args((Function *)in_stack_fffffffffffffd00);
  local_30 = &local_40;
  local_58 = llvm::iterator_range<const_llvm::Argument_*>::begin(local_30);
  local_60 = llvm::iterator_range<const_llvm::Argument_*>::end(local_30);
  for (; local_58 != local_60; local_58 = local_58 + 0x28) {
    local_68 = local_58;
    std::unique_ptr<Func,_std::default_delete<Func>_>::operator->
              ((unique_ptr<Func,_std::default_delete<Func>_> *)0x28db10);
    Func::getVarName_abi_cxx11_
              ((Func *)CONCAT17(in_stack_fffffffffffffd9f,
                                CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
    llvm::Value::getType((Value *)local_68);
    local_98 = Program::getType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    std::make_unique<Value,std::__cxx11::string,Type*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd28,
               (Type **)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    std::__cxx11::string::~string(local_90);
    std::unique_ptr<Func,_std::default_delete<Func>_>::operator->
              ((unique_ptr<Func,_std::default_delete<Func>_> *)0x28dbb1);
    std::unique_ptr<Expr,std::default_delete<Expr>>::
    unique_ptr<Value,std::default_delete<Value>,void>
              ((unique_ptr<Expr,_std::default_delete<Expr>_> *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    Func::createExpr((Func *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                     in_stack_fffffffffffffd18,
                     (unique_ptr<Expr,_std::default_delete<Expr>_> *)in_stack_fffffffffffffd10);
    std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr
              ((unique_ptr<Expr,_std::default_delete<Expr>_> *)in_stack_fffffffffffffd10);
    std::unique_ptr<Value,_std::default_delete<Value>_>::~unique_ptr
              ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffd00);
  }
  local_b0 = llvm::Function::args((Function *)in_stack_fffffffffffffd00);
  pAVar2 = llvm::iterator_range<const_llvm::Argument_*>::begin(&local_b0);
  local_c0 = llvm::Function::args((Function *)in_stack_fffffffffffffd00);
  pAVar3 = llvm::iterator_range<const_llvm::Argument_*>::end(&local_c0);
  if (pAVar2 != pAVar3) {
    pFVar4 = std::unique_ptr<Func,_std::default_delete<Func>_>::operator->
                       ((unique_ptr<Func,_std::default_delete<Func>_> *)0x28dd78);
    bVar1 = llvm::Function::isVarArg((Function *)0x28dd8d);
    Func::setVarArg(pFVar4,bVar1);
  }
  local_d0 = llvm::Value::getName();
  llvm::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  Prefix.Length = (size_t)in_stack_fffffffffffffd10;
  Prefix.Data = (char *)in_stack_fffffffffffffd08;
  bVar1 = llvm::StringRef::startswith((StringRef *)in_stack_fffffffffffffd00,Prefix);
  local_24a = false;
  if (bVar1) {
    local_f0 = llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    Suffix.Length = (size_t)in_stack_fffffffffffffd10;
    Suffix.Data = (char *)in_stack_fffffffffffffd08;
    bVar1 = llvm::StringRef::endswith((StringRef *)in_stack_fffffffffffffd00,Suffix);
    local_24a = true;
    if (!bVar1) {
      local_110 = llvm::Value::getName();
      llvm::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
      Suffix_00.Length = (size_t)in_stack_fffffffffffffd10;
      Suffix_00.Data = (char *)in_stack_fffffffffffffd08;
      bVar1 = llvm::StringRef::endswith((StringRef *)in_stack_fffffffffffffd00,Suffix_00);
      local_24a = true;
      if (!bVar1) {
        local_130 = llvm::Value::getName();
        llvm::StringRef::StringRef
                  ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
        Suffix_01.Length = (size_t)in_stack_fffffffffffffd10;
        Suffix_01.Data = (char *)in_stack_fffffffffffffd08;
        bVar1 = llvm::StringRef::endswith((StringRef *)in_stack_fffffffffffffd00,Suffix_01);
        local_24a = true;
        if (!bVar1) {
          local_150 = llvm::Value::getName();
          llvm::StringRef::StringRef
                    ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
          Suffix_02.Length = (size_t)in_stack_fffffffffffffd10;
          Suffix_02.Data = (char *)in_stack_fffffffffffffd08;
          bVar1 = llvm::StringRef::endswith((StringRef *)in_stack_fffffffffffffd00,Suffix_02);
          local_24a = true;
          if (!bVar1) {
            local_170 = llvm::Value::getName();
            llvm::StringRef::StringRef
                      ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
            Suffix_03.Length = (size_t)in_stack_fffffffffffffd10;
            Suffix_03.Data = (char *)in_stack_fffffffffffffd08;
            bVar1 = llvm::StringRef::endswith((StringRef *)in_stack_fffffffffffffd00,Suffix_03);
            local_24a = true;
            if (!bVar1) {
              local_190 = llvm::Value::getName();
              in_stack_fffffffffffffd28 = local_190._8_8_;
              llvm::StringRef::StringRef
                        ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
              Suffix_04.Length = (size_t)in_stack_fffffffffffffd10;
              Suffix_04.Data = (char *)in_stack_fffffffffffffd08;
              in_stack_fffffffffffffd27 =
                   llvm::StringRef::endswith((StringRef *)in_stack_fffffffffffffd00,Suffix_04);
              local_24a = (bool)in_stack_fffffffffffffd27;
            }
          }
        }
      }
    }
  }
  if (local_24a != false) {
    in_stack_fffffffffffffd10 = local_10;
    std::unique_ptr<Func,_std::default_delete<Func>_>::operator->
              ((unique_ptr<Func,_std::default_delete<Func>_> *)0x28e1b1);
    pIVar5 = TypeHandler::setSigned
                       (in_stack_fffffffffffffd28,
                        (IntegerType *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20)
                       );
    pFVar4 = std::unique_ptr<Func,_std::default_delete<Func>_>::operator->
                       ((unique_ptr<Func,_std::default_delete<Func>_> *)0x28e1d2);
    pFVar4->returnType = &pIVar5->super_Type;
  }
  llvmFunc = local_1a8;
  std::unique_ptr<Func,_std::default_delete<Func>_>::unique_ptr
            (local_8,(unique_ptr<Func,_std::default_delete<Func>_> *)local_10);
  Program::addFunction(in_stack_fffffffffffffd10,llvmFunc,local_8);
  std::unique_ptr<Func,_std::default_delete<Func>_>::~unique_ptr
            ((unique_ptr<Func,_std::default_delete<Func>_> *)in_stack_fffffffffffffd10);
  std::unique_ptr<Func,_std::default_delete<Func>_>::~unique_ptr
            ((unique_ptr<Func,_std::default_delete<Func>_> *)in_stack_fffffffffffffd10);
  return;
}

Assistant:

static void declareFunc(const llvm::Function* func, Program& program) {
    auto decl = std::make_unique<Func>(func, &program, func->isDeclaration());
    for (const llvm::Value& arg : func->args()) {
        auto argVal = std::make_unique<Value>(decl->getVarName(), program.getType(arg.getType()));
        decl->createExpr(&arg, std::move(argVal));
    }

    if (func->args().begin() != func->args().end()) {
        decl->setVarArg(func->isVarArg());
    }

    // FIXME: a hack for CPAchecker -- do this optional
    if (func->getName().startswith("__VERIFIER_nondet_") &&
        (func->getName().endswith("_int") || 
         func->getName().endswith("_long") || 
         func->getName().endswith("_short") || 
         func->getName().endswith("_char") || 
         func->getName().endswith("_float") ||
         func->getName().endswith("_double"))) {
        decl->returnType = program.typeHandler.setSigned(static_cast<IntegerType*>(decl->returnType));
    }
    program.addFunction(func, std::move(decl));
}